

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_info_fwd.hpp
# Opt level: O0

error_info * toml::make_error_info<>(string *title,source_location *loc,string *msg)

{
  source_location *in_RDI;
  error_info ei;
  source_location *this;
  error_info *peVar1;
  error_info *in_stack_fffffffffffffe40;
  allocator<char> *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  error_info local_151;
  string *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  source_location *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  error_info *in_stack_ffffffffffffff70;
  
  this = in_RDI;
  std::__cxx11::string::string(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  source_location::source_location(this,in_RDI);
  std::__cxx11::string::string(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  peVar1 = &local_151;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  error_info::error_info
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  source_location::~source_location(this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  error_info::error_info(in_stack_fffffffffffffe40,peVar1);
  detail::make_error_info_rec((error_info *)in_RDI);
  error_info::~error_info((error_info *)this);
  error_info::~error_info((error_info *)this);
  return (error_info *)this;
}

Assistant:

error_info make_error_info(
    std::string title, source_location loc, std::string msg, Ts&& ... tail)
{
    error_info ei(std::move(title), std::move(loc), std::move(msg));
    return detail::make_error_info_rec(ei, std::forward<Ts>(tail) ... );
}